

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateMetadataPragma
          (FileGenerator *this,Printer *printer,string *info_path)

{
  byte bVar1;
  Formatter format;
  Printer *in_stack_ffffffffffffff08;
  allocator *paVar2;
  Formatter *in_stack_ffffffffffffff10;
  allocator local_d1;
  string local_d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  Formatter *in_stack_ffffffffffffff50;
  string local_a8 [55];
  allocator local_71;
  string local_70 [112];
  
  Formatter::Formatter
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4d4608);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 0) {
      bVar1 = std::__cxx11::string::empty();
      if ((bVar1 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"guard",&local_71);
        Formatter::Set<std::__cxx11::string>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        paVar2 = (allocator *)&stack0xffffffffffffff57;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"pragma",paVar2);
        Formatter::Set<std::__cxx11::string>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
        paVar2 = &local_d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"info_path",paVar2);
        Formatter::Set<std::__cxx11::string>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        Formatter::operator()<>(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      }
    }
  }
  Formatter::~Formatter((Formatter *)0x4d4848);
  return;
}

Assistant:

void FileGenerator::GenerateMetadataPragma(io::Printer* printer,
                                           const std::string& info_path) {
  Formatter format(printer, variables_);
  if (!info_path.empty() && !options_.annotation_pragma_name.empty() &&
      !options_.annotation_guard_name.empty()) {
    format.Set("guard", options_.annotation_guard_name);
    format.Set("pragma", options_.annotation_pragma_name);
    format.Set("info_path", info_path);
    format(
        "#ifdef $guard$\n"
        "#pragma $pragma$ \"$info_path$\"\n"
        "#endif  // $guard$\n");
  }
}